

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool DataTypeApplyOpFromText
               (char *buf,char *initial_value_buf,ImGuiDataType data_type,void *data_ptr,
               char *scalar_format)

{
  int iVar1;
  char *pcVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  float fVar6;
  double dVar7;
  float arg1f;
  int arg0i;
  int arg1i;
  int data_backup [2];
  float local_5c;
  double local_58;
  double *local_50;
  int local_44;
  size_t local_40;
  undefined1 local_38 [8];
  
  while( true ) {
    bVar3 = *buf;
    uVar4 = (ulong)bVar3;
    if (0x2f < uVar4) break;
    if ((0x100000200U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x8c0000000000U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_001611c1;
      break;
    }
    buf = (char *)((byte *)buf + 1);
  }
  bVar3 = 0;
LAB_001611d7:
  if (*buf == 0) {
LAB_0016144d:
    bVar5 = false;
  }
  else {
    if (3 < (int)data_type) {
      __assert_fail("data_type < ImGuiDataType_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0x2140,
                    "bool DataTypeApplyOpFromText(const char *, const char *, ImGuiDataType, void *, const char *)"
                   );
    }
    local_40 = GDataTypeSize[data_type];
    local_50 = (double *)data_ptr;
    memcpy(local_38,data_ptr,local_40);
    local_44 = 0;
    local_5c = 0.0;
    switch((ulong)data_type) {
    case 0:
      pcVar2 = "%d";
      if (scalar_format != (char *)0x0) {
        pcVar2 = scalar_format;
      }
      local_58 = (double)CONCAT44(local_58._4_4_,*(float *)local_50);
      if (bVar3 == 0) {
LAB_00161454:
        iVar1 = __isoc99_sscanf(buf,pcVar2,&local_58);
        if (iVar1 == 1) {
          fVar6 = local_58._0_4_;
          goto LAB_001615e8;
        }
      }
      else {
        iVar1 = __isoc99_sscanf(initial_value_buf,pcVar2,&local_58);
        if (iVar1 < 1) goto LAB_0016144d;
        if (bVar3 == 0x2a) {
          iVar1 = __isoc99_sscanf(buf,"%f",&local_5c);
          if (iVar1 != 0) {
            fVar6 = (float)(int)((float)(int)local_58._0_4_ * local_5c);
LAB_001615e8:
            *(float *)local_50 = fVar6;
          }
        }
        else if (bVar3 == 0x2f) {
          iVar1 = __isoc99_sscanf(buf,"%f",&local_5c);
          if ((iVar1 != 0) && ((local_5c != 0.0 || (NAN(local_5c))))) {
            fVar6 = (float)(int)((float)(int)local_58._0_4_ / local_5c);
            goto LAB_001615e8;
          }
        }
        else {
          if (bVar3 != 0x2b) goto LAB_00161454;
          iVar1 = __isoc99_sscanf(buf,"%d",&local_44);
          if (iVar1 != 0) {
            fVar6 = (float)(local_44 + (int)local_58._0_4_);
            goto LAB_001615e8;
          }
        }
      }
      break;
    case 1:
      pcVar2 = "%u";
      if (scalar_format != (char *)0x0) {
        pcVar2 = scalar_format;
      }
      local_58 = (double)CONCAT44(local_58._4_4_,*(float *)local_50);
      if (bVar3 == 0) {
LAB_00161478:
        iVar1 = __isoc99_sscanf(buf,pcVar2,&local_58);
        if (iVar1 == 1) {
          fVar6 = local_58._0_4_;
          goto LAB_0016161f;
        }
      }
      else {
        iVar1 = __isoc99_sscanf(initial_value_buf,pcVar2,&local_58);
        if (iVar1 < 1) goto LAB_0016144d;
        if (bVar3 == 0x2a) {
          iVar1 = __isoc99_sscanf(buf,"%f",&local_5c);
          if (iVar1 != 0) {
            fVar6 = (float)((ulong)local_58 & 0xffffffff) * local_5c;
LAB_0016161a:
            fVar6 = (float)(long)fVar6;
LAB_0016161f:
            *(float *)local_50 = fVar6;
          }
        }
        else if (bVar3 == 0x2f) {
          iVar1 = __isoc99_sscanf(buf,"%f",&local_5c);
          if ((iVar1 != 0) && ((local_5c != 0.0 || (NAN(local_5c))))) {
            fVar6 = (float)(long)((float)((ulong)local_58 & 0xffffffff) / local_5c);
            goto LAB_0016161f;
          }
        }
        else {
          if (bVar3 != 0x2b) goto LAB_00161478;
          iVar1 = __isoc99_sscanf(buf,"%d",&local_44);
          if (iVar1 != 0) {
            fVar6 = (float)((ulong)local_58 & 0xffffffff) + local_5c;
            goto LAB_0016161a;
          }
        }
      }
      break;
    case 2:
      local_58 = (double)CONCAT44(local_58._4_4_,*(float *)local_50);
      if (((bVar3 != 0) && (iVar1 = __isoc99_sscanf(initial_value_buf,"%f",&local_58), iVar1 < 1))
         || (iVar1 = __isoc99_sscanf(buf,"%f",&local_5c), iVar1 < 1)) goto LAB_0016144d;
      if (bVar3 == 0x2a) {
        fVar6 = local_58._0_4_ * local_5c;
      }
      else if (bVar3 == 0x2f) {
        if ((local_5c == 0.0) && (!NAN(local_5c))) break;
        fVar6 = local_58._0_4_ / local_5c;
      }
      else {
        fVar6 = local_5c;
        if (bVar3 == 0x2b) {
          fVar6 = local_58._0_4_ + local_5c;
        }
      }
      *(float *)local_50 = fVar6;
      break;
    case 3:
      local_58 = *local_50;
      if (((bVar3 != 0) && (iVar1 = __isoc99_sscanf(initial_value_buf,"%lf",&local_58), iVar1 < 1))
         || (iVar1 = __isoc99_sscanf(buf,"%lf",&local_5c), iVar1 < 1)) goto LAB_0016144d;
      if (bVar3 == 0x2a) {
        dVar7 = (double)local_5c * local_58;
      }
      else if (bVar3 == 0x2f) {
        if ((local_5c == 0.0) && (!NAN(local_5c))) break;
        dVar7 = local_58 / (double)local_5c;
      }
      else if (bVar3 == 0x2b) {
        dVar7 = (double)local_5c + local_58;
      }
      else {
        dVar7 = (double)local_5c;
      }
      *local_50 = dVar7;
    }
    iVar1 = bcmp(local_38,local_50,local_40);
    bVar5 = iVar1 != 0;
  }
  return bVar5;
LAB_001611c1:
  do {
    do {
      buf = (char *)((byte *)buf + 1);
    } while (*buf == 0x20);
  } while (*buf == 9);
  goto LAB_001611d7;
}

Assistant:

static bool DataTypeApplyOpFromText(const char* buf, const char* initial_value_buf, ImGuiDataType data_type, void* data_ptr, const char* scalar_format)
{
    while (ImCharIsSpace((unsigned int)*buf))
        buf++;

    // We don't support '-' op because it would conflict with inputing negative value.
    // Instead you can use +-100 to subtract from an existing value
    char op = buf[0];
    if (op == '+' || op == '*' || op == '/')
    {
        buf++;
        while (ImCharIsSpace((unsigned int)*buf))
            buf++;
    }
    else
    {
        op = 0;
    }
    if (!buf[0])
        return false;

    IM_ASSERT(data_type < ImGuiDataType_COUNT);
    int data_backup[2];
    IM_ASSERT(GDataTypeSize[data_type] <= sizeof(data_backup));
    memcpy(data_backup, data_ptr, GDataTypeSize[data_type]);

    int arg1i = 0;
    float arg1f = 0.0f;
    if (data_type == ImGuiDataType_Int32)
    {
        if (!scalar_format)
            scalar_format = "%d";
        int* v = (int*)data_ptr;
        int arg0i = *v;
        if (op && sscanf(initial_value_buf, scalar_format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (int)(arg0i + arg1i); }                   // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (int)(arg0i * arg1f); }                   // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (int)(arg0i / arg1f); }  // Divide
        else                { if (sscanf(buf, scalar_format, &arg0i) == 1) *v = arg0i; }                    // Assign integer constant
    }
    else if (data_type == ImGuiDataType_Uint32)
    {
        if (!scalar_format)
            scalar_format = "%u";
        ImU32* v = (unsigned int*)data_ptr;
        ImU32 arg0i = *v;
        if (op && sscanf(initial_value_buf, scalar_format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (ImU32)(arg0i + arg1f); }                 // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (ImU32)(arg0i * arg1f); }                 // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (ImU32)(arg0i / arg1f); }// Divide
        else                { if (sscanf(buf, scalar_format, &arg0i) == 1) *v = arg0i; }                    // Assign integer constant
    }
    else if (data_type == ImGuiDataType_Float)
    {
        // For floats we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in
        scalar_format = "%f";
        float* v = (float*)data_ptr;
        float arg0f = *v;
        if (op && sscanf(initial_value_buf, scalar_format, &arg0f) < 1)
            return false;
        if (sscanf(buf, scalar_format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_Double)
    {
        scalar_format = "%lf"; // scanf differentiate float/double unlike printf which forces everything to double because of ellipsis
        double* v = (double*)data_ptr;
        double arg0f = *v;
        if (op && sscanf(initial_value_buf, scalar_format, &arg0f) < 1)
            return false;
        if (sscanf(buf, scalar_format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    return memcmp(data_backup, data_ptr, GDataTypeSize[data_type]) != 0;
}